

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

ssize_t __thiscall Log::write(Log *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  pointer __dest;
  String *this_00;
  
  if ((__buf == (void *)0x0) ||
     (peVar1 = (((Log *)CONCAT44(in_register_00000034,__fd))->mData).
               super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 == (element_type *)0x0)) goto LAB_0016669c;
  uVar6 = (uint)__n;
  if (uVar6 == 0xffffffff) {
    sVar5 = strlen((char *)__buf);
    uVar6 = (uint)sVar5;
  }
  if ((int)uVar6 < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Log.h",
                  0xb4,"Log Log::write(const char *, int)");
  }
  if (uVar6 == 0) goto LAB_0016669c;
  this_00 = &peVar1->out;
  if (peVar1->outPtr != (String *)0x0) {
    this_00 = peVar1->outPtr;
  }
  sVar2 = (this_00->mString)._M_string_length;
  iVar7 = (int)sVar2;
  if (peVar1->disableSpacingOverride == 0) {
    if ((iVar7 == 0) || (peVar1->spacing == false)) goto LAB_00166678;
    cVar3 = String::at(this_00,sVar2 - 1);
    iVar4 = isspace((int)cVar3);
    if (iVar4 != 0) goto LAB_00166678;
    iVar4 = isspace((int)*__buf);
    if (iVar4 != 0) goto LAB_00166678;
    std::__cxx11::string::resize((ulong)this_00);
    (this_00->mString)._M_dataplus._M_p[iVar7] = ' ';
    __dest = (this_00->mString)._M_dataplus._M_p + (long)iVar7 + 1;
  }
  else {
    peVar1->disableSpacingOverride = peVar1->disableSpacingOverride + -1;
LAB_00166678:
    std::__cxx11::string::resize((ulong)this_00);
    __dest = (this_00->mString)._M_dataplus._M_p + iVar7;
  }
  memcpy(__dest,__buf,(ulong)uVar6);
LAB_0016669c:
  Log(this,(Log *)CONCAT44(in_register_00000034,__fd));
  return (ssize_t)this;
}

Assistant:

Log write(const char *data, int len = -1)
    {
        if (data && mData) {
            if (len == -1)
                len = strlen(data);
            assert(len >= 0);
            if (len) {
                String &str = mData->outPtr ? *mData->outPtr : mData->out;
                const int outLength = str.size();
                if (mData->disableSpacingOverride) {
                    --mData->disableSpacingOverride;
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                } else if (mData->spacing && outLength && !isspace(str.at(str.size() - 1)) && !isspace(*data)) {
                    str.resize(outLength + len + 1);
                    str[outLength] = ' ';
                    memcpy(str.data() + outLength + 1, data, len);
                } else {
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                }
            }
        }
        return *this;
    }